

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack20_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x100000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xc;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 0x100 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * 0x10000000 | uVar2;
  uVar2 = in[3] - base >> 4;
  out[2] = uVar2;
  out[2] = (in[4] - base) * 0x10000 | uVar2;
  uVar2 = in[4] - base >> 0x10;
  out[3] = uVar2;
  uVar2 = (in[5] - base) * 0x10 | uVar2;
  out[3] = uVar2;
  out[3] = (in[6] - base) * 0x1000000 | uVar2;
  uVar2 = in[6] - base >> 8;
  out[4] = uVar2;
  out[4] = (in[7] - base) * 0x1000 | uVar2;
  return out + 5;
}

Assistant:

uint32_t * pack20_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 20  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 20  -  16 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 20  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 20  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    ++in;

    return out;
}